

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void attributeDeclSplit(void *ctx,xmlChar *elem,xmlChar *name,int type,int def,xmlChar *defaultValue
                       ,xmlEnumerationPtr tree)

{
  xmlSchemaSAXPlugPtr ctxt;
  xmlChar *defaultValue_local;
  int def_local;
  int type_local;
  xmlChar *name_local;
  xmlChar *elem_local;
  void *ctx_local;
  
  if (((ctx == (void *)0x0) || (*(long *)((long)ctx + 0x10) == 0)) ||
     (*(long *)(*(long *)((long)ctx + 0x10) + 0x40) == 0)) {
    xmlFreeEnumeration(tree);
  }
  else {
    (**(code **)(*(long *)((long)ctx + 0x10) + 0x40))
              (*(undefined8 *)((long)ctx + 0x20),elem,name,type,def,defaultValue,tree);
  }
  return;
}

Assistant:

static void
attributeDeclSplit(void *ctx, const xmlChar * elem,
                   const xmlChar * name, int type, int def,
                   const xmlChar * defaultValue, xmlEnumerationPtr tree)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if ((ctxt != NULL) && (ctxt->user_sax != NULL) &&
        (ctxt->user_sax->attributeDecl != NULL)) {
	ctxt->user_sax->attributeDecl(ctxt->user_data, elem, name, type,
	                              def, defaultValue, tree);
    } else {
	xmlFreeEnumeration(tree);
    }
}